

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void gen_b64grams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  int iVar1;
  ulong uVar2;
  uint __args;
  uint64_t offset;
  uint64_t uVar3;
  ulong uVar4;
  
  if (3 < size) {
    uVar4 = 0;
    __args = 0;
    for (uVar3 = 0; size != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = get_b64_value(mem[uVar3]);
      uVar2 = uVar4 + 1;
      uVar4 = 0;
      if (-1 < iVar1) {
        __args = __args * 0x40 + iVar1 & 0xffffff;
        uVar4 = uVar2;
      }
      if (3 < uVar4) {
        std::function<void_(unsigned_int)>::operator()(cb,__args);
      }
    }
  }
  return;
}

Assistant:

void gen_b64grams(const uint8_t *mem, uint64_t size,
                  const TrigramCallback &cb) {
    if (size < 4) {
        return;
    }

    uint32_t gram4 = 0;
    uint64_t good_run = 0;

    for (uint64_t offset = 0; offset < size; offset++) {
        int next = get_b64_value(mem[offset]);
        if (next < 0) {
            good_run = 0;
        } else {
            gram4 = ((gram4 << 6U) + next) & 0xFFFFFFU;
            good_run += 1;
        }
        if (good_run >= 4) {
            cb(gram4);
        }
    }
}